

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getopt.c
# Opt level: O3

int getopt(int ___argc,char **___argv,char *__shortopts)

{
  int iVar1;
  char *pcVar2;
  int __c;
  char *pcVar3;
  char cVar4;
  
  if ((optreset != 0) || (cVar4 = *getopt::place, cVar4 == '\0')) {
    optreset = 0;
    if ((___argc <= optind) || (pcVar3 = ___argv[optind], *pcVar3 != '-')) {
LAB_00116877:
      getopt::place = "";
      optreset = 0;
      return -1;
    }
    cVar4 = pcVar3[1];
    if (cVar4 == '\0') {
      pcVar3 = pcVar3 + 1;
      optopt = 0x2d;
      __c = 0x2d;
      getopt::place = pcVar3;
      pcVar2 = strchr(__shortopts,0x2d);
      if (pcVar2 == (char *)0x0) {
        return -1;
      }
      goto LAB_0011694f;
    }
    if (cVar4 == '-') {
      optind = optind + 1;
      goto LAB_00116877;
    }
    getopt::place = pcVar3 + 1;
  }
  pcVar3 = getopt::place + 1;
  __c = (int)cVar4;
  getopt::place = pcVar3;
  optopt = __c;
  if (cVar4 == ':') {
    cVar4 = ':';
  }
  else {
    pcVar2 = strchr(__shortopts,__c);
    if (pcVar2 != (char *)0x0) {
LAB_0011694f:
      if (pcVar2[1] != ':') {
        if (*pcVar3 == '\0') {
          optind = optind + 1;
          optarg = (char *)0x0;
          return __c;
        }
        optarg = (char *)0x0;
        return __c;
      }
      if (*pcVar3 == '\0') {
        iVar1 = optind + 1;
        if (___argc <= iVar1) {
          getopt::place = "";
          if (*__shortopts == ':') {
            optind = iVar1;
            return 0x3a;
          }
          if (opterr != 0) {
            optind = iVar1;
            getopt_cold_1();
            return 0x3f;
          }
          optind = iVar1;
          return 0x3f;
        }
        pcVar3 = ___argv[(long)optind + 1];
        optind = iVar1;
      }
      getopt::place = "";
      optind = optind + 1;
      optarg = pcVar3;
      return __c;
    }
    if (cVar4 == '-') {
      return -1;
    }
  }
  if (*pcVar3 == '\0') {
    optind = optind + 1;
  }
  if (opterr == 0) {
    return 0x3f;
  }
  if (cVar4 == '?') {
    return 0x3f;
  }
  if (*__shortopts != ':') {
    getopt_cold_2();
    return 0x3f;
  }
  return 0x3f;
}

Assistant:

int
getopt(int nargc, char * const *nargv, char * ostr)
  /*int nargc;
	char * const *nargv;
  const char *ostr;*/
{
	extern char *__progname;
	static char *place = EMSG;		/* option letter processing */
	char *oli;				/* option letter list index */

	if (optreset || !*place) {		/* update scanning pointer */
		optreset = 0;
		if (optind >= nargc || *(place = nargv[optind]) != '-') {
			place = EMSG;
			return (-1);
		}
		if (place[1] && *++place == '-') {	/* found "--" */
			++optind;
			place = EMSG;
			return (-1);
		}
	}					/* option letter okay? */
	if ((optopt = (int)*place++) == (int)':' ||
	    !(oli = strchr(ostr, optopt))) {
		/*
		 * if the user didn't specify '-' as an option,
		 * assume it means -1.
		 */
		if (optopt == (int)'-')
			return (-1);
		if (!*place)
			++optind;
		if (opterr && *ostr != ':' && optopt != BADCH)
			(void)fprintf(stderr,
			    "%s: illegal option -- %c\n", __progname, optopt);
		return (BADCH);
	}
	if (*++oli != ':') {			/* don't need argument */
		optarg = NULL;
		if (!*place)
			++optind;
	}
	else {					/* need an argument */
		if (*place)			/* no white space */
			optarg = place;
		else if (nargc <= ++optind) {	/* no arg */
			place = EMSG;
			if (*ostr == ':')
				return (BADARG);
			if (opterr)
				(void)fprintf(stderr,
				    "%s: option requires an argument -- %c\n",
				    __progname, optopt);
			return (BADCH);
		}
	 	else				/* white space */
			optarg = nargv[optind];
		place = EMSG;
		++optind;
	}
	return (optopt);			/* dump back option letter */
}